

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderTextureImplFBO.cpp
# Opt level: O0

void __thiscall
sf::priv::RenderTextureImplFBO::updateTexture(RenderTextureImplFBO *this,uint param_2)

{
  _func_void_GLenum_GLuint *p_Var1;
  bool bVar2;
  ulong uVar3;
  pointer ppVar4;
  long *in_RDI;
  iterator multisampleIter;
  iterator iter;
  Lock lock;
  Uint64 contextId;
  uint in_stack_000000ac;
  char *in_stack_000000b0;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  GLint in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  bool local_69;
  _Self local_50;
  _Self local_48;
  _Self local_40 [3];
  _Self local_28 [2];
  Uint64 local_18;
  
  if (((((*(byte *)((long)in_RDI + 0x84) & 1) != 0) && ((int)in_RDI[0xe] != 0)) &&
      (*(int *)((long)in_RDI + 0x74) != 0)) &&
     (uVar3 = (**(code **)(*in_RDI + 0x18))(in_RDI,1), (uVar3 & 1) != 0)) {
    local_18 = Context::getActiveContextId();
    Lock::Lock((Lock *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
               (Mutex *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    local_28[0]._M_node =
         (_Base_ptr)
         std::
         map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>
         ::find((map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>
                 *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                (key_type_conflict *)0x17218e);
    local_40[0]._M_node =
         (_Base_ptr)
         std::
         map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>
         ::find((map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>
                 *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                (key_type_conflict *)0x1721b8);
    local_48._M_node =
         (_Base_ptr)
         std::
         map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>
         ::end((map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>
                *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    bVar2 = std::operator!=(local_28,&local_48);
    local_69 = false;
    if (bVar2) {
      local_50._M_node =
           (_Base_ptr)
           std::
           map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>
           ::end((map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>
                  *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
      local_69 = std::operator!=(local_40,&local_50);
    }
    p_Var1 = sf_ptrc_glBindFramebufferEXT;
    if (local_69 != false) {
      ppVar4 = std::_Rb_tree_iterator<std::pair<const_unsigned_long_long,_unsigned_int>_>::
               operator->((_Rb_tree_iterator<std::pair<const_unsigned_long_long,_unsigned_int>_> *)
                          0x17224e);
      (*p_Var1)(0x8ca9,ppVar4->second);
      glCheckError(in_stack_000000b0,in_stack_000000ac,(char *)this);
      in_stack_ffffffffffffff60 = *(GLint *)((long)in_RDI + 0x74);
      (*sf_ptrc_glBlitFramebufferEXT)
                (0,0,(GLint)in_RDI[0xe],in_stack_ffffffffffffff60,0,0,(GLint)in_RDI[0xe],
                 in_stack_ffffffffffffff60,0x4000,0x2600);
      glCheckError(in_stack_000000b0,in_stack_000000ac,(char *)this);
      p_Var1 = sf_ptrc_glBindFramebufferEXT;
      ppVar4 = std::_Rb_tree_iterator<std::pair<const_unsigned_long_long,_unsigned_int>_>::
               operator->((_Rb_tree_iterator<std::pair<const_unsigned_long_long,_unsigned_int>_> *)
                          0x1722f6);
      (*p_Var1)(0x8ca9,ppVar4->second);
      glCheckError(in_stack_000000b0,in_stack_000000ac,(char *)this);
    }
    Lock::~Lock((Lock *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
  }
  return;
}

Assistant:

void RenderTextureImplFBO::updateTexture(unsigned int)
{
    // If multisampling is enabled, we need to resolve by blitting
    // from our FBO with multisample renderbuffer attachments
    // to our FBO to which our target texture is attached

#ifndef SFML_OPENGL_ES

    // In case of multisampling, make sure both FBOs
    // are already available within the current context
    if (m_multisample && m_width && m_height && activate(true))
    {
        Uint64 contextId = Context::getActiveContextId();

        Lock lock(mutex);

        std::map<Uint64, unsigned int>::iterator iter = m_frameBuffers.find(contextId);
        std::map<Uint64, unsigned int>::iterator multisampleIter = m_multisampleFrameBuffers.find(contextId);

        if ((iter != m_frameBuffers.end()) && (multisampleIter != m_multisampleFrameBuffers.end()))
        {
            // Set up the blit target (draw framebuffer) and blit (from the read framebuffer, our multisample FBO)
            glCheck(GLEXT_glBindFramebuffer(GLEXT_GL_DRAW_FRAMEBUFFER, iter->second));
            glCheck(GLEXT_glBlitFramebuffer(0, 0, m_width, m_height, 0, 0, m_width, m_height, GL_COLOR_BUFFER_BIT, GL_NEAREST));
            glCheck(GLEXT_glBindFramebuffer(GLEXT_GL_DRAW_FRAMEBUFFER, multisampleIter->second));
        }
    }

#endif // SFML_OPENGL_ES

}